

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

void polyscope::warning(string *baseMessage,string *detailMessage)

{
  _Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
  *this;
  WarningMessage *pWVar1;
  __type _Var2;
  size_type sVar3;
  _Map_pointer ppWVar4;
  WarningMessage *pWVar5;
  WarningMessage *__args;
  size_t sVar6;
  WarningMessage *__args_00;
  long lVar7;
  _Map_pointer ppWVar8;
  bool bVar9;
  long lVar10;
  WarningMessage *w;
  WarningMessage *__lhs;
  undefined1 local_78 [64];
  int local_38;
  
  pWVar1 = DAT_00483960;
  bVar9 = false;
  pWVar5 = DAT_00483950;
  ppWVar8 = DAT_00483958;
  __lhs = DAT_00483940;
  while (__lhs != pWVar1) {
    _Var2 = std::operator==(&__lhs->baseMessage,baseMessage);
    if (_Var2) {
      __lhs->repeatCount = __lhs->repeatCount + 1;
      bVar9 = true;
    }
    __lhs = __lhs + 1;
    if (__lhs == pWVar5) {
      __lhs = ppWVar8[1];
      ppWVar8 = ppWVar8 + 1;
      pWVar5 = __lhs + 7;
    }
  }
  if (bVar9) {
    return;
  }
  std::__cxx11::string::string((string *)local_78,(string *)baseMessage);
  std::__cxx11::string::string((string *)(local_78 + 0x20),(string *)detailMessage);
  local_38 = 0;
  if (DAT_00483960 != DAT_00483970 + -1) {
    std::allocator_traits<std::allocator<polyscope::(anonymous_namespace)::WarningMessage>>::
    construct<polyscope::(anonymous_namespace)::WarningMessage,polyscope::(anonymous_namespace)::WarningMessage>
              ((allocator_type *)DAT_00483960,(WarningMessage *)local_78,__args);
    DAT_00483960 = DAT_00483960 + 1;
    goto LAB_001aa2c7;
  }
  sVar3 = std::
          deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
          ::size((deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                  *)DAT_00483960);
  if (sVar3 == 0x1c71c71c71c71c7) {
    std::__throw_length_error("cannot create std::deque larger than max_size()");
  }
  if ((ulong)((long)DAT_00483938 -
             ((long)DAT_00483978 - (long)(anonymous_namespace)::warningMessages >> 3)) < 2) {
    lVar10 = (long)DAT_00483978 - (long)DAT_00483958 >> 3;
    if ((_Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
         *)(lVar10 * 2 + 4) < DAT_00483938) {
      ppWVar8 = (anonymous_namespace)::warningMessages +
                ((ulong)((long)DAT_00483938 - (lVar10 + 2)) >> 1);
      if (ppWVar8 < DAT_00483958) {
        sVar6 = (long)DAT_00483978 + (8 - (long)DAT_00483958);
        ppWVar4 = ppWVar8;
        if (sVar6 != 0) {
LAB_001aa231:
          memmove(ppWVar4,DAT_00483958,sVar6);
        }
      }
      else {
        sVar6 = (long)DAT_00483978 + (8 - (long)DAT_00483958);
        if (sVar6 != 0) {
          ppWVar4 = (_Map_pointer)((long)ppWVar8 + ((lVar10 + 1) * 8 - sVar6));
          goto LAB_001aa231;
        }
      }
    }
    else {
      lVar7 = (long)DAT_00483938 * 2 +
              (ulong)(DAT_00483938 ==
                     (_Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                      *)0x0);
      this = (_Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
              *)(lVar7 + 2);
      ppWVar4 = std::
                _Deque_base<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                ::_M_allocate_map(this,(size_t)DAT_00483958);
      ppWVar8 = ppWVar4 + ((ulong)(lVar7 - lVar10) >> 1);
      sVar6 = (long)DAT_00483978 + (8 - (long)DAT_00483958);
      if (sVar6 != 0) {
        memmove(ppWVar8,DAT_00483958,sVar6);
      }
      operator_delete((anonymous_namespace)::warningMessages);
      (anonymous_namespace)::warningMessages = ppWVar4;
      DAT_00483938 = this;
    }
    DAT_00483978 = ppWVar8 + lVar10;
    DAT_00483948 = *ppWVar8;
    DAT_00483950 = DAT_00483948 + 7;
    _DAT_00483968 = *DAT_00483978;
    DAT_00483970 = _DAT_00483968 + 7;
    DAT_00483958 = ppWVar8;
  }
  pWVar5 = (WarningMessage *)operator_new(0x1f8);
  DAT_00483978[1] = pWVar5;
  std::allocator_traits<std::allocator<polyscope::(anonymous_namespace)::WarningMessage>>::
  construct<polyscope::(anonymous_namespace)::WarningMessage,polyscope::(anonymous_namespace)::WarningMessage>
            ((allocator_type *)DAT_00483960,(WarningMessage *)local_78,__args_00);
  DAT_00483960 = DAT_00483978[1];
  DAT_00483970 = DAT_00483960 + 7;
  _DAT_00483968 = DAT_00483960;
  DAT_00483978 = DAT_00483978 + 1;
LAB_001aa2c7:
  anon_unknown_1::WarningMessage::~WarningMessage((WarningMessage *)local_78);
  return;
}

Assistant:

void warning(std::string baseMessage, std::string detailMessage) {

  // Look for a message with the same name
  bool found = false;
  for (WarningMessage& w : warningMessages) {
    if (w.baseMessage == baseMessage) {
      found = true;
      w.repeatCount++;
    }
  }

  // Create a new message
  if (!found) {
    warningMessages.push_back(WarningMessage{baseMessage, detailMessage, 0});
  }
}